

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

void rescale(Mat *colorfulImage,Mat *image)

{
  int in_R8D;
  undefined4 local_70 [2];
  Mat *local_68;
  undefined8 local_60;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  _InputArray local_48;
  
  local_60 = 0;
  local_70[0] = 0x1010000;
  local_48.sz.width = 0;
  local_48.sz.height = 0;
  local_48.flags = 0x2010000;
  local_68 = colorfulImage;
  local_48.obj = image;
  cv::cvtColor((cv *)local_70,&local_48,(_OutputArray *)0x6,0,in_R8D);
  local_4c = image->rows;
  while (600 < (int)local_4c) {
    local_60 = 0;
    local_70[0] = 0x1010000;
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x2010000;
    local_50 = image->cols / 2;
    local_4c = local_4c >> 1;
    local_68 = image;
    local_48.obj = image;
    cv::resize(0,0,local_70,&local_48,&local_50,1);
    local_60 = 0;
    local_70[0] = 0x1010000;
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x2010000;
    local_58 = colorfulImage->cols / 2;
    local_54 = colorfulImage->rows / 2;
    local_68 = colorfulImage;
    local_48.obj = colorfulImage;
    cv::resize(0,local_70,&local_48,&local_58,1);
    local_4c = image->rows;
  }
  return;
}

Assistant:

void rescale(Mat& colorfulImage, Mat& image){
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    // Shrink the image size
    while(image.rows > 600){
        resize(image, image, Size(image.cols/2,image.rows/2)); 
        resize(colorfulImage, colorfulImage, Size(colorfulImage.cols/2,colorfulImage.rows/2));
    }
}